

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::compute_split_estimate
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *left_child_res,
          vec<2U,_float> *right_child_res,vq_node *parent_node)

{
  float fVar1;
  uint uVar2;
  uint *puVar3;
  vec<2U,_float> *in_RCX;
  vec<2U,_float> *in_RDX;
  vec<2U,_float> *in_RSI;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *in_RDI;
  float fVar4;
  double dist_1;
  vec<2U,_float> *v_1;
  uint i_1;
  double opposite_dist;
  vec<2U,_float> opposite;
  double dist;
  vec<2U,_float> *v;
  uint i;
  double furthest_dist;
  vec<2U,_float> furthest;
  float in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff64;
  vec<2U,_float> *in_stack_ffffffffffffff70;
  vec<2U,_float> in_stack_ffffffffffffff78;
  vec<2U,_float> local_78;
  double local_70;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_68;
  uint local_5c;
  double local_58;
  vec<2U,_float> local_50;
  double local_48;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_40;
  float local_34;
  double local_30;
  vec<2U,_float> local_28;
  vec<2U,_float> *local_20;
  vec<2U,_float> *local_18;
  vec<2U,_float> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  vec<2U,_float>::vec((vec<2U,_float> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c);
  local_30 = -1.0;
  local_34 = 0.0;
  while( true ) {
    fVar4 = local_34;
    fVar1 = (float)vector<unsigned_int>::size((vector<unsigned_int> *)(local_20 + 3));
    if ((uint)fVar1 <= (uint)fVar4) break;
    puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 3),(uint)local_34)
    ;
    local_40 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar3);
    fVar4 = vec<2U,_float>::squared_distance(&local_40->first,local_20);
    local_48 = (double)fVar4;
    if (local_30 < local_48) {
      local_30 = local_48;
      vec<2U,_float>::operator=(&local_28,&local_40->first);
    }
    local_34 = (float)((int)local_34 + 1);
  }
  vec<2U,_float>::vec((vec<2U,_float> *)CONCAT44(fVar4,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c);
  local_58 = -1.0;
  local_5c = 0;
  while( true ) {
    uVar5 = local_5c;
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(local_20 + 3));
    if (uVar2 <= uVar5) break;
    puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(local_20 + 3),local_5c);
    local_68 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar3);
    fVar1 = vec<2U,_float>::squared_distance(&local_68->first,&local_28);
    local_70 = (double)fVar1;
    if (local_58 < local_70) {
      local_58 = local_70;
      vec<2U,_float>::operator=(&local_50,&local_68->first);
    }
    local_5c = local_5c + 1;
  }
  operator+((vec<2U,_float> *)in_stack_ffffffffffffff78.m_s,in_stack_ffffffffffffff70);
  crnlib::operator*((vec<2U,_float> *)in_RDI,fVar4);
  vec<2U,_float>::operator=(local_10,&local_78);
  operator+((vec<2U,_float> *)in_stack_ffffffffffffff78.m_s,in_stack_ffffffffffffff70);
  crnlib::operator*((vec<2U,_float> *)in_RDI,fVar4);
  vec<2U,_float>::operator=(local_18,(vec<2U,_float> *)&stack0xffffffffffffff78);
  return;
}

Assistant:

void compute_split_estimate(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node) {
    VectorType furthest(0);
    double furthest_dist = -1.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double dist = v.squared_distance(parent_node.m_centroid);
      if (dist > furthest_dist) {
        furthest_dist = dist;
        furthest = v;
      }
    }

    VectorType opposite(0);
    double opposite_dist = -1.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double dist = v.squared_distance(furthest);
      if (dist > opposite_dist) {
        opposite_dist = dist;
        opposite = v;
      }
    }

    left_child_res = (furthest + parent_node.m_centroid) * .5f;
    right_child_res = (opposite + parent_node.m_centroid) * .5f;
  }